

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O2

void btGeometryUtil::getVerticesFromPlaneEquations
               (btAlignedObjectArray<btVector3> *planeEquations,
               btAlignedObjectArray<btVector3> *verticesOut)

{
  btVector3 *v;
  uint uVar1;
  btVector3 *pbVar2;
  btVector3 bVar3;
  btVector3 bVar4;
  btVector3 bVar5;
  bool bVar6;
  btVector3 *this;
  uint uVar7;
  btVector3 *v_00;
  long lVar8;
  btScalar bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint local_b0;
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  uint local_6c;
  btVector3 local_68;
  long local_58;
  ulong local_50;
  ulong local_48;
  btAlignedObjectArray<btVector3> *local_40;
  long local_38;
  
  uVar1 = planeEquations->m_size;
  local_48 = 0;
  local_50 = 0;
  if (0 < (int)uVar1) {
    local_50 = (ulong)uVar1;
  }
  local_b0 = 2;
  local_58 = 1;
  local_40 = verticesOut;
  for (; local_48 != local_50; local_48 = local_48 + 1) {
    v_00 = planeEquations->m_data + local_48;
    uVar7 = local_b0;
    for (local_38 = local_58; (int)local_38 < (int)uVar1; local_38 = local_38 + 1) {
      lVar8 = (ulong)uVar7 << 4;
      this = planeEquations->m_data + local_38;
      local_6c = uVar7;
      for (; (int)uVar7 < (int)uVar1; uVar7 = uVar7 + 1) {
        pbVar2 = planeEquations->m_data;
        v = (btVector3 *)((long)pbVar2->m_floats + lVar8);
        local_a0 = btVector3::cross(this,v);
        local_80 = btVector3::cross(v,v_00);
        local_90 = btVector3::cross(v_00,this);
        bVar9 = btVector3::length2(&local_a0);
        if (0.0001 < bVar9) {
          bVar9 = btVector3::length2(&local_80);
          if (0.0001 < bVar9) {
            bVar9 = btVector3::length2(&local_90);
            bVar5.m_floats = local_80.m_floats;
            bVar4.m_floats = local_90.m_floats;
            bVar3.m_floats = local_a0.m_floats;
            if (0.0001 < bVar9) {
              fVar12 = v_00->m_floats[2] * local_a0.m_floats[2] +
                       v_00->m_floats[0] * local_a0.m_floats[0] +
                       v_00->m_floats[1] * local_a0.m_floats[1];
              if (1e-06 < ABS(fVar12)) {
                local_a0.m_floats[0] = local_a0.m_floats[0] * v_00->m_floats[3];
                fVar12 = -1.0 / fVar12;
                local_a0.m_floats[1] = local_a0.m_floats[1] * v_00->m_floats[3];
                local_a0.m_floats[2] = local_a0.m_floats[2] * v_00->m_floats[3];
                local_a0.m_floats[3] = bVar3.m_floats[3];
                fVar10 = this->m_floats[3] * local_80.m_floats[0];
                local_80.m_floats[1] = this->m_floats[3] * local_80.m_floats[1];
                local_80.m_floats[0] = fVar10;
                local_80.m_floats[2] = bVar5.m_floats[2];
                local_80.m_floats[2] = this->m_floats[3] * local_80.m_floats[2];
                local_80.m_floats[3] = bVar5.m_floats[3];
                fVar11 = *(float *)((long)pbVar2->m_floats + lVar8 + 0xc) * local_90.m_floats[0];
                local_90.m_floats[1] =
                     *(float *)((long)pbVar2->m_floats + lVar8 + 0xc) * local_90.m_floats[1];
                local_90.m_floats[0] = fVar11;
                local_90.m_floats[2] = bVar4.m_floats[2];
                local_90.m_floats[2] =
                     *(float *)((long)pbVar2->m_floats + lVar8 + 0xc) * local_90.m_floats[2];
                local_90.m_floats[3] = bVar4.m_floats[3];
                local_68.m_floats[1] =
                     fVar12 * (local_90.m_floats[1] + local_80.m_floats[1] + local_a0.m_floats[1]);
                local_68.m_floats[0] = fVar12 * (fVar11 + fVar10 + local_a0.m_floats[0]);
                local_68.m_floats[3] = local_a0.m_floats[3];
                local_68.m_floats[2] =
                     (local_80.m_floats[2] + local_a0.m_floats[2] + local_90.m_floats[2]) * fVar12;
                bVar6 = isPointInsidePlanes(planeEquations,&local_68,0.01);
                if (bVar6) {
                  btAlignedObjectArray<btVector3>::push_back(local_40,&local_68);
                }
              }
            }
          }
        }
        lVar8 = lVar8 + 0x10;
      }
      uVar7 = local_6c + 1;
    }
    local_b0 = local_b0 + 1;
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void	btGeometryUtil::getVerticesFromPlaneEquations(const btAlignedObjectArray<btVector3>& planeEquations , btAlignedObjectArray<btVector3>& verticesOut )
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		

		for (int j=i+1;j<numbrushes;j++)
		{
			const btVector3& N2 = planeEquations[j];
				
			for (int k=j+1;k<numbrushes;k++)
			{

				const btVector3& N3 = planeEquations[k];

				btVector3 n2n3; n2n3 = N2.cross(N3);
				btVector3 n3n1; n3n1 = N3.cross(N1);
				btVector3 n1n2; n1n2 = N1.cross(N2);
				
				if ( ( n2n3.length2() > btScalar(0.0001) ) &&
					 ( n3n1.length2() > btScalar(0.0001) ) &&
					 ( n1n2.length2() > btScalar(0.0001) ) )
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )  
					//P =  -------------------------------------------------------------------------  
					//   N1 . ( N2 * N3 )  


					btScalar quotient = (N1.dot(n2n3));
					if (btFabs(quotient) > btScalar(0.000001))
					{
						quotient = btScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						btVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations,potentialVertex,btScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}